

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DeadReckoningCalculator.cpp
# Opt level: O0

EulerAngles * __thiscall
KDIS::UTILS::DeadReckoningCalculator::toEulerAngularVelocity
          (EulerAngles *__return_storage_ptr__,DeadReckoningCalculator *this,Vector *angVel,
          EulerAngles *Orientation)

{
  float fVar1;
  float fVar2;
  float fVar3;
  KFLOAT32 *pKVar4;
  KFLOAT32 KVar5;
  KFLOAT32 KVar6;
  float fVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  KFLOAT32 sin_phi;
  KFLOAT32 cos_phi;
  KFLOAT32 psi;
  KFLOAT32 theta;
  KFLOAT32 phi;
  KFLOAT32 dphi;
  KFLOAT32 dtheta;
  KFLOAT32 dpsi;
  EulerAngles *Orientation_local;
  Vector *angVel_local;
  DeadReckoningCalculator *this_local;
  
  KVar5 = DATA_TYPE::EulerAngles::GetPhiInRadians(Orientation);
  KVar6 = DATA_TYPE::EulerAngles::GetThetaInRadians(Orientation);
  DATA_TYPE::EulerAngles::GetPsiInRadians(Orientation);
  dVar8 = std::cos((double)(ulong)(uint)KVar5);
  dVar9 = std::sin((double)(ulong)(uint)KVar5);
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,1);
  fVar1 = (float)*pKVar4;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,2);
  fVar2 = (float)*pKVar4;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,1);
  fVar3 = (float)*pKVar4;
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,2);
  fVar7 = (float)*pKVar4;
  dVar10 = std::cos((double)(ulong)(uint)KVar6);
  fVar7 = (fVar3 * SUB84(dVar9,0) + fVar7 * SUB84(dVar8,0)) / SUB84(dVar10,0);
  pKVar4 = DATA_TYPE::Vector::operator[](angVel,0);
  fVar3 = (float)*pKVar4;
  dVar10 = std::sin((double)(ulong)(uint)KVar6);
  DATA_TYPE::EulerAngles::EulerAngles
            (__return_storage_ptr__,(KFLOAT32)fVar7,
             (KFLOAT32)(fVar1 * SUB84(dVar8,0) + -(fVar2 * SUB84(dVar9,0))),
             (KFLOAT32)(fVar7 * SUB84(dVar10,0) + fVar3));
  return __return_storage_ptr__;
}

Assistant:

EulerAngles DeadReckoningCalculator::toEulerAngularVelocity( const Vector & angVel, const EulerAngles & Orientation )
{
    KFLOAT32 dpsi, dtheta, dphi;

    const KFLOAT32 phi = Orientation.GetPhiInRadians();
    const KFLOAT32 theta = Orientation.GetThetaInRadians();
    const KFLOAT32 psi = Orientation.GetPsiInRadians();

    KFLOAT32 cos_phi = cos( phi );
    KFLOAT32 sin_phi = sin( phi );

    dtheta = angVel[1] * cos_phi - angVel[2] * sin_phi;
    dpsi  = ( angVel[1] * sin_phi + angVel[2] * cos_phi ) / cos( theta ); //could be unstable when cos(theta) is close to 0
    dphi = angVel[0] + dpsi * sin( theta );

    return EulerAngles( ( const KFLOAT32 )dpsi, ( const KFLOAT32 )dtheta, ( const KFLOAT32 )dphi );
}